

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.c
# Opt level: O1

void virtual_mem_main(rx_context *rx__context,void *rx__data)

{
  w_status wVar1;
  size_t sVar2;
  rx__op in_ECX;
  rx__op rVar3;
  size_t i_1;
  char *in_R8;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char *in_R9;
  char *pcVar7;
  size_t i;
  ulong uVar8;
  void *pvVar9;
  size_t i_2;
  w_vmem mem;
  alloc_info info;
  rx_severity in_stack_ffffffffffffff98;
  rx_severity rVar10;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  rx_severity in_stack_ffffffffffffffa8;
  undefined4 uStack_54;
  char *in_stack_ffffffffffffffb0;
  alloc_info local_48;
  
  uVar8 = 0;
  wVar1 = w_vmem_create((w_vmem *)&stack0xffffffffffffffa8,(void *)0x0,0xa00000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0xd2,in_ECX,in_R8,in_R9,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  iVar6 = (int)in_R9;
  pvVar9 = (void *)CONCAT44(uStack_54,in_stack_ffffffffffffffa8);
  pcVar5 = (char *)((long)pvVar9 + 0xa00000);
  get_alloc_info(&local_48,pvVar9,pcVar5);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0xd8,in_R8,iVar6,
                   in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0xd9;
  pcVar7 = "0xA00000";
  rx__uint_assess_comparison
            (rx__context,local_48.size,0xa00000,RX__OP_EQUAL,"info.size","0xA00000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0xd9),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar5);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),0,"info.committed",(char *)0xda,(int)pcVar7
             ,rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar3 = 0x107a9a;
  pcVar4 = (char *)0xdb;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0xdb,(int)pcVar7,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)CONCAT44(uStack_54,in_stack_ffffffffffffffa8);
  wVar1 = w_vmem_commit((w_vmem *)&stack0xffffffffffffffa8,pvVar9,0x200000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0xe0,rVar3,pcVar4,pcVar7,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,rVar10),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar5);
  iVar6 = (int)pcVar7;
  sVar2 = w_get_commit_granularity();
  do {
    *(undefined4 *)((long)pvVar9 + uVar8) = 0xdecaffff;
    uVar8 = uVar8 + sVar2;
  } while (uVar8 < 0x200000);
  pvVar9 = (void *)CONCAT44(uStack_54,in_stack_ffffffffffffffa8);
  pcVar7 = pcVar5;
  get_alloc_info(&local_48,pvVar9,pcVar5);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0xe5,pcVar4,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0xe6;
  iVar6 = 0x107aa6;
  uVar8 = 0;
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x200000,RX__OP_EQUAL,"info.size","0x200000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0xe6),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),1,"info.committed",(char *)0xe7,iVar6,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar4 = (char *)0xe8;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0xe8,iVar6,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x200000);
  get_alloc_info(&local_48,pvVar9,pcVar5);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0xec,pcVar4,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0xed;
  pcVar4 = "0x800000";
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x800000,RX__OP_EQUAL,"info.size","0x800000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0xed),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),0,"info.committed",(char *)0xee,(int)pcVar4
             ,rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar3 = 0x107a9a;
  pcVar5 = (char *)0xef;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0xef,(int)pcVar4,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x900000);
  wVar1 = w_vmem_commit((w_vmem *)&stack0xffffffffffffffa8,pvVar9,0x100000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0xf4,rVar3,pcVar5,pcVar4,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,rVar10),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar7);
  iVar6 = (int)pcVar4;
  sVar2 = w_get_commit_granularity();
  do {
    *(undefined4 *)((long)pvVar9 + uVar8) = 0xdecaffff;
    uVar8 = uVar8 + sVar2;
  } while (uVar8 < 0x100000);
  pvVar9 = (void *)CONCAT44(uStack_54,in_stack_ffffffffffffffa8);
  pcVar4 = pcVar7;
  get_alloc_info(&local_48,pvVar9,pcVar7);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0xf9,pcVar5,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0xfa;
  iVar6 = 0x107aa6;
  uVar8 = 0;
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x200000,RX__OP_EQUAL,"info.size","0x200000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0xfa),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar4);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),1,"info.committed",(char *)0xfb,iVar6,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar5 = (char *)0xfc;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0xfc,iVar6,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x200000);
  get_alloc_info(&local_48,pvVar9,pcVar7);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0x100,pcVar5,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0x101;
  iVar6 = 0x107ab8;
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x700000,RX__OP_EQUAL,"info.size","0x700000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x101),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar4);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),0,"info.committed",(char *)0x102,iVar6,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar5 = (char *)0x103;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0x103,iVar6,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x900000);
  get_alloc_info(&local_48,pvVar9,pcVar7);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0x107,pcVar5,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0x108;
  pcVar7 = "0x100000";
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x108),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar4);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),1,"info.committed",(char *)0x109,
             (int)pcVar7,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar3 = 0x107a9a;
  pcVar5 = (char *)0x10a;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0x10a,(int)pcVar7,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  wVar1 = w_vmem_uncommit((w_vmem *)&stack0xffffffffffffffa8,
                          (void *)CONCAT44(uStack_54,in_stack_ffffffffffffffa8),0x200000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0x10f,rVar3,pcVar5,pcVar7,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,rVar10),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar4);
  iVar6 = (int)pcVar7;
  pvVar9 = (void *)CONCAT44(uStack_54,in_stack_ffffffffffffffa8);
  get_alloc_info(&local_48,pvVar9,pcVar4);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0x113,pcVar5,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0x114;
  pcVar7 = "0x900000";
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x900000,RX__OP_EQUAL,"info.size","0x900000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x114),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar4);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),0,"info.committed",(char *)0x115,
             (int)pcVar7,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar5 = (char *)0x116;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0x116,(int)pcVar7,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x900000);
  get_alloc_info(&local_48,pvVar9,pcVar4);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0x11a,pcVar5,
                   (int)pcVar7,rVar10,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),1,"info.committed",(char *)0x11b,
             (int)pcVar7,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar3 = 0x107a9a;
  pcVar5 = (char *)0x11c;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0x11c,(int)pcVar7,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x100000);
  wVar1 = w_vmem_commit((w_vmem *)&stack0xffffffffffffffa8,pvVar9,0x700000);
  rx__int_assess_comparison
            (rx__context,(long)wVar1,0x121,rVar3,pcVar5,pcVar7,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,rVar10),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar4);
  iVar6 = (int)pcVar7;
  sVar2 = w_get_commit_granularity();
  do {
    *(undefined4 *)((long)pvVar9 + uVar8) = 0xdecaffff;
    uVar8 = uVar8 + sVar2;
  } while (uVar8 < 0x700000);
  pvVar9 = (void *)CONCAT44(uStack_54,in_stack_ffffffffffffffa8);
  pcVar7 = pcVar4;
  get_alloc_info(&local_48,pvVar9,pcVar4);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0x126,pcVar5,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0x127;
  iVar6 = 0x10806a;
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x127),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),0,"info.committed",(char *)0x128,iVar6,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar5 = (char *)0x129;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0x129,iVar6,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x100000);
  get_alloc_info(&local_48,pvVar9,pcVar4);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0x12d,pcVar5,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0x12e;
  iVar6 = 0x107ab8;
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x700000,RX__OP_EQUAL,"info.size","0x700000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x12e),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),1,"info.committed",(char *)0x12f,iVar6,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar5 = (char *)0x130;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0x130,iVar6,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x800000);
  get_alloc_info(&local_48,pvVar9,pcVar4);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0x134,pcVar5,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0x135;
  iVar6 = 0x10806a;
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x135),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),0,"info.committed",(char *)0x136,iVar6,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar5 = (char *)0x137;
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0x137,iVar6,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar9 = (void *)(CONCAT44(uStack_54,in_stack_ffffffffffffffa8) + 0x900000);
  get_alloc_info(&local_48,pvVar9,pcVar4);
  rx__assess_value(rx__context,(uint)(local_48.addr == pvVar9),0x107a60,(char *)0x13b,pcVar5,iVar6,
                   rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rVar10 = 0x13c;
  iVar6 = 0x10806a;
  rx__uint_assess_comparison
            (rx__context,local_48.size,0x100000,RX__OP_EQUAL,"info.size","0x100000",
             (char *)CONCAT44(in_stack_ffffffffffffff9c,0x13c),in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,pcVar7);
  rx__bool_assess_value
            (rx__context,(uint)(local_48.committed != 0),1,"info.committed",(char *)0x13d,iVar6,
             rVar10,(char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  rx__bool_assess_value
            (rx__context,(uint)(local_48.shared != 0),0,"info.shared",(char *)0x13e,iVar6,rVar10,
             (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  w_vmem_destroy((w_vmem *)&stack0xffffffffffffffa8,0xa00000);
  return;
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    return rx_main(0, NULL, argc, argv) == RX_SUCCESS ? 0 : 1;
}